

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateArgsortLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *layer_00;
  bool bVar1;
  int iVar2;
  int64 iVar3;
  string *psVar4;
  Tensor *this_00;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string err_1;
  undefined1 local_b0 [4];
  int rank;
  undefined1 local_90 [8];
  string err;
  ArgSortLayerParams *params;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar1;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar1;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    layer_00 = local_20;
    if (local_38 == 0) {
      local_3a = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"Argsort",(allocator<char> *)((long)&params + 7));
      validateInputOutputRankEquality
                (__return_storage_ptr__,layer_00,&local_60,&this->blobNameToRank);
      std::__cxx11::string::~string((string *)&local_60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
      bVar1 = Result::good(__return_storage_ptr__);
      if (!bVar1) {
        local_3a = 1;
      }
      local_38 = (uint)!bVar1;
      if ((local_3a & 1) == 0) {
        Result::~Result(__return_storage_ptr__);
      }
      if (local_38 == 0) {
        err.field_2._8_8_ = Specification::NeuralNetworkLayer::argsort(local_20);
        iVar3 = Specification::ArgSortLayerParams::axis((ArgSortLayerParams *)err.field_2._8_8_);
        if (iVar3 < 0) {
          psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,
                         "Value of \'axis\' is negative for layer of type \'ArgSort\' and name \'",
                         psVar4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,"\', which is not supported. It must be positive.");
          std::__cxx11::string::~string((string *)local_b0);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_90);
          local_38 = 1;
          std::__cxx11::string::~string((string *)local_90);
        }
        else {
          iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(local_20);
          if (0 < iVar2) {
            this_00 = Specification::NeuralNetworkLayer::inputtensor(local_20,0);
            err_1.field_2._12_4_ = Specification::Tensor::rank(this_00);
            iVar3 = Specification::ArgSortLayerParams::axis((ArgSortLayerParams *)err.field_2._8_8_)
            ;
            if ((iVar3 < 0) ||
               (iVar3 = Specification::ArgSortLayerParams::axis
                                  ((ArgSortLayerParams *)err.field_2._8_8_),
               (int)err_1.field_2._12_4_ <= iVar3)) {
              iVar3 = Specification::ArgSortLayerParams::axis
                                ((ArgSortLayerParams *)err.field_2._8_8_);
              std::__cxx11::to_string(&local_198,iVar3);
              std::operator+(&local_178,"Value of \'axis\' is ",&local_198);
              std::operator+(&local_158,&local_178,", but it must be in the range [0,");
              std::__cxx11::to_string(&local_1b8,err_1.field_2._12_4_);
              std::operator+(&local_138,&local_158,&local_1b8);
              std::operator+(&local_118,&local_138,") for layer of type \'ArgSort\' and name \'");
              psVar4 = Specification::NeuralNetworkLayer::name_abi_cxx11_(local_20);
              std::operator+(&local_f8,&local_118,psVar4);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,&local_f8,"\'.");
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_118);
              std::__cxx11::string::~string((string *)&local_138);
              std::__cxx11::string::~string((string *)&local_1b8);
              std::__cxx11::string::~string((string *)&local_158);
              std::__cxx11::string::~string((string *)&local_178);
              std::__cxx11::string::~string((string *)&local_198);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_d8);
              local_38 = 1;
              std::__cxx11::string::~string((string *)local_d8);
              return __return_storage_ptr__;
            }
          }
          Result::Result(__return_storage_ptr__);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateArgsortLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Argsort", blobNameToRank));

    const auto& params = layer.argsort();

    if (params.axis() < 0) {
        const std::string err = "Value of 'axis' is negative for layer of type 'ArgSort' and name '" + layer.name() + "', which is not supported. It must be positive.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < 0 || params.axis() >= rank) {
            const std::string err = "Value of 'axis' is " + std::to_string(params.axis()) + \
                                    ", but it must be in the range [0," \
                                    + std::to_string(rank) + ") for layer of type 'ArgSort' and name '" + layer.name() + "'.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return Result();
}